

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest13::initTest(FunctionalTest13 *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  ulong uVar7;
  uchar *puVar8;
  int local_124;
  GLuint po_id;
  GLint link_status;
  uint n_po_id;
  uint n_po_ids;
  GLuint po_ids [5];
  undefined8 local_f8;
  char *vs_body_raw_ptr;
  string vs_body;
  char *te_body_raw_ptr;
  string te_body;
  char *tc_body_raw_ptr;
  string tc_body;
  char *gs_body_raw_ptr;
  undefined1 local_68 [8];
  string gs_body;
  char *fs_body_raw_ptr;
  string fs_body;
  uint n_id;
  Functions *gl;
  FunctionalTest13 *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x1a00))(0,0,this->m_to_width,this->m_to_height);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glViewport() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b6a);
  (**(code **)(lVar6 + 0x1680))(0);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b6e);
  (**(code **)(lVar6 + 0x6d8))(1,&this->m_pipeline_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenProgramPipelines() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b72);
  (**(code **)(lVar6 + 0x98))(this->m_pipeline_id);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glBindProgramPipeline() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x1b75);
  fs_body.field_2._12_4_ = 0;
  do {
    if (1 < (uint)fs_body.field_2._12_4_) {
      (**(code **)(lVar6 + 0x6f8))(1,&this->m_to_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bab);
      (**(code **)(lVar6 + 0xb8))(0xde1,this->m_to_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bae);
      (**(code **)(lVar6 + 0x1380))(0xde1,1,0x8814,this->m_to_width,this->m_to_height);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glTexStorage2D() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bb1);
      (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGenFramebuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bb5);
      (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bb8);
      (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_to_id,0);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bbb);
      (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bbf);
      (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bc2);
      (**(code **)(lVar6 + 0xfd8))(0x8e72,1);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glPatchParameteri() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bc6);
      (**(code **)(lVar6 + 0xff0))(0xd05,1);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glPixelStorei() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1bca);
      auVar1 = ZEXT416(this->m_to_width * this->m_to_height * 4) * ZEXT816(4);
      uVar7 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar7 = 0xffffffffffffffff;
      }
      puVar8 = (uchar *)operator_new__(uVar7);
      this->m_read_buffer = puVar8;
      return;
    }
    getFragmentShaderBody_abi_cxx11_((string *)&fs_body_raw_ptr,this,fs_body.field_2._12_4_);
    gs_body.field_2._8_8_ = std::__cxx11::string::c_str();
    getGeometryShaderBody_abi_cxx11_((string *)local_68,this,fs_body.field_2._12_4_);
    tc_body.field_2._8_8_ = std::__cxx11::string::c_str();
    getTessellationControlShaderBody_abi_cxx11_
              ((string *)&tc_body_raw_ptr,this,fs_body.field_2._12_4_);
    te_body.field_2._8_8_ = std::__cxx11::string::c_str();
    getTessellationEvaluationShaderBody_abi_cxx11_
              ((string *)&te_body_raw_ptr,this,fs_body.field_2._12_4_);
    vs_body.field_2._8_8_ = std::__cxx11::string::c_str();
    getVertexShaderBody_abi_cxx11_((string *)&vs_body_raw_ptr,this,fs_body.field_2._12_4_);
    local_f8 = std::__cxx11::string::c_str();
    GVar4 = (**(code **)(lVar6 + 0x3f8))(0x8b30,1,(undefined1 *)((long)&gs_body.field_2 + 8));
    this->m_fs_po_ids[(uint)fs_body.field_2._12_4_] = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1b86);
    GVar4 = (**(code **)(lVar6 + 0x3f8))(0x8dd9,1,(undefined1 *)((long)&tc_body.field_2 + 8));
    this->m_gs_po_ids[(uint)fs_body.field_2._12_4_] = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1b89);
    GVar4 = (**(code **)(lVar6 + 0x3f8))(0x8e88,1,(undefined1 *)((long)&te_body.field_2 + 8));
    this->m_tc_po_ids[(uint)fs_body.field_2._12_4_] = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1b8c);
    GVar4 = (**(code **)(lVar6 + 0x3f8))(0x8e87,1,(undefined1 *)((long)&vs_body.field_2 + 8));
    this->m_te_po_ids[(uint)fs_body.field_2._12_4_] = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1b8f);
    GVar4 = (**(code **)(lVar6 + 0x3f8))(0x8b31,1,&local_f8);
    this->m_vs_po_ids[(uint)fs_body.field_2._12_4_] = GVar4;
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"glCreateShaderProgramv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x1b92);
    n_po_id = this->m_fs_po_ids[(uint)fs_body.field_2._12_4_];
    n_po_ids = this->m_gs_po_ids[(uint)fs_body.field_2._12_4_];
    po_ids[0] = this->m_tc_po_ids[(uint)fs_body.field_2._12_4_];
    po_ids[1] = this->m_te_po_ids[(uint)fs_body.field_2._12_4_];
    po_ids[2] = this->m_vs_po_ids[(uint)fs_body.field_2._12_4_];
    link_status = 5;
    for (po_id = 0; po_id < 5; po_id = po_id + 1) {
      local_124 = 0;
      (**(code **)(lVar6 + 0x9d8))((&n_po_id)[po_id],0x8b82,&local_124);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x1ba0);
      if (local_124 != 1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader program object linking failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x1ba4);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    std::__cxx11::string::~string((string *)&vs_body_raw_ptr);
    std::__cxx11::string::~string((string *)&te_body_raw_ptr);
    std::__cxx11::string::~string((string *)&tc_body_raw_ptr);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)&fs_body_raw_ptr);
    fs_body.field_2._12_4_ = fs_body.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void FunctionalTest13::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	/* Make sure no program is used */
	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Generate a pipeline object */
	gl.genProgramPipelines(1, &m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines() call failed.");

	gl.bindProgramPipeline(m_pipeline_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	/* Initialize all shader programs */
	for (unsigned int n_id = 0; n_id < 2 /* variants for each shader type */; ++n_id)
	{
		std::string fs_body			= getFragmentShaderBody(n_id);
		const char* fs_body_raw_ptr = fs_body.c_str();
		std::string gs_body			= getGeometryShaderBody(n_id);
		const char* gs_body_raw_ptr = gs_body.c_str();
		std::string tc_body			= getTessellationControlShaderBody(n_id);
		const char* tc_body_raw_ptr = tc_body.c_str();
		std::string te_body			= getTessellationEvaluationShaderBody(n_id);
		const char* te_body_raw_ptr = te_body.c_str();
		std::string vs_body			= getVertexShaderBody(n_id);
		const char* vs_body_raw_ptr = vs_body.c_str();

		m_fs_po_ids[n_id] = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1 /* count */, &fs_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

		m_gs_po_ids[n_id] = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1 /* count */, &gs_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

		m_tc_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_CONTROL_SHADER, 1 /* count */, &tc_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

		m_te_po_ids[n_id] = gl.createShaderProgramv(GL_TESS_EVALUATION_SHADER, 1 /* count */, &te_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

		m_vs_po_ids[n_id] = gl.createShaderProgramv(GL_VERTEX_SHADER, 1 /* count */, &vs_body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

		/* Verify that all shader program objects have been linked successfully */
		const glw::GLuint po_ids[] = {
			m_fs_po_ids[n_id], m_gs_po_ids[n_id], m_tc_po_ids[n_id], m_te_po_ids[n_id], m_vs_po_ids[n_id],
		};
		const unsigned int n_po_ids = sizeof(po_ids) / sizeof(po_ids[0]);

		for (unsigned int n_po_id = 0; n_po_id < n_po_ids; ++n_po_id)
		{
			glw::GLint  link_status = GL_FALSE;
			glw::GLuint po_id		= po_ids[n_po_id];

			gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

			if (link_status != GL_TRUE)
			{
				TCU_FAIL("Shader program object linking failed.");
			}
		} /* for (all shader program objects) */
	}	 /* for (both shader program object variants) */

	/* Generate a texture object. We will use the base mip-map as a render-target */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_RGBA32F, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");

	/* Generate and configure a FBO we will use for the draw call */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up tessellation */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	/* Set up pixel storage alignment */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* Allocate enough space to hold color attachment data */
	m_read_buffer = (unsigned char*)new float[m_to_width * m_to_height * 4 /* rgba */];
}